

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aVaryingInterpolationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Accuracy::VaryingInterpolationTests::init
          (VaryingInterpolationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  Float<unsigned_int,_8,_23,_127,_3U> FVar1;
  Float<unsigned_int,_8,_23,_127,_3U> FVar2;
  char *__s;
  long *plVar3;
  InterpolationCase *pIVar4;
  long *plVar5;
  size_type *psVar6;
  Vec3 *maxVal;
  long lVar7;
  Precision local_a8;
  allocator<char> local_a1;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  string baseName;
  long *local_50 [2];
  long local_40 [2];
  
  baseName._M_dataplus._M_p._0_2_ = 0x7000;
  FVar1 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&baseName);
  baseName._M_dataplus._M_p._0_2_ = 0xf000;
  FVar2 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&baseName);
  if (init()::coordRanges == '\0') {
    init((VaryingInterpolationTests *)(ulong)FVar1.m_value,(EVP_PKEY_CTX *)(ulong)FVar2.m_value);
  }
  local_a8 = PRECISION_LOWP;
  do {
    lVar7 = 7;
    maxVal = &init::coordRanges[0].maxVal;
    do {
      if ((int)*(Precision *)(maxVal + 1) <= (int)local_a8) {
        __s = glu::getPrecisionName(local_a8);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_a1);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
        local_a0 = &local_90;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_90 = *plVar5;
          lStack_88 = plVar3[3];
        }
        else {
          local_90 = *plVar5;
          local_a0 = (long *)*plVar3;
        }
        local_98 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
        psVar6 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar6) {
          baseName.field_2._M_allocated_capacity = *psVar6;
          baseName.field_2._8_8_ = plVar3[3];
          baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
        }
        else {
          baseName.field_2._M_allocated_capacity = *psVar6;
          baseName._M_dataplus._M_p = (pointer)*plVar3;
        }
        baseName._M_string_length = plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pIVar4 = (InterpolationCase *)operator_new(0x98);
        InterpolationCase::InterpolationCase
                  (pIVar4,(this->super_TestCaseGroup).m_context,baseName._M_dataplus._M_p,
                   ::glcts::fixed_sample_locations_values + 1,local_a8,maxVal + -1,maxVal,false);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
        pIVar4 = (InterpolationCase *)operator_new(0x98);
        context = (this->super_TestCaseGroup).m_context;
        local_a0 = &local_90;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,baseName._M_dataplus._M_p,
                   baseName._M_dataplus._M_p + baseName._M_string_length);
        std::__cxx11::string::append((char *)&local_a0);
        InterpolationCase::InterpolationCase
                  (pIVar4,context,(char *)local_a0,::glcts::fixed_sample_locations_values + 1,
                   local_a8,maxVal + -1,maxVal,true);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pIVar4);
        if (local_a0 != &local_90) {
          operator_delete(local_a0,local_90 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)baseName._M_dataplus._M_p != &baseName.field_2) {
          operator_delete(baseName._M_dataplus._M_p,baseName.field_2._M_allocated_capacity + 1);
        }
      }
      maxVal = (Vec3 *)((long)(maxVal + 3) + 4);
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    local_a8 = local_a8 + PRECISION_MEDIUMP;
  } while (local_a8 != PRECISION_LAST);
  return 3;
}

Assistant:

void VaryingInterpolationTests::init (void)
{
	DE_STATIC_ASSERT(glu::PRECISION_LOWP+1		== glu::PRECISION_MEDIUMP);
	DE_STATIC_ASSERT(glu::PRECISION_MEDIUMP+1	== glu::PRECISION_HIGHP);

	// Exp = Emax-3, Mantissa = 0
	float minF32 = tcu::Float32((0u<<31) | (0xfcu<<23) | 0x0u).asFloat();
	float maxF32 = tcu::Float32((1u<<31) | (0xfcu<<23) | 0x0u).asFloat();
	float minF16 = tcu::Float16((deUint16)((0u<<15) | (0x1cu<<10) | 0x0u)).asFloat();
	float maxF16 = tcu::Float16((deUint16)((1u<<15) | (0x1cu<<10) | 0x0u)).asFloat();

	static const struct
	{
		const char*		name;
		Vec3			minVal;
		Vec3			maxVal;
		glu::Precision	minPrecision;
	} coordRanges[] =
	{
		{ "zero_to_one",		Vec3(  0.0f,   0.0f,   0.0f), Vec3(  1.0f,   1.0f,   1.0f), glu::PRECISION_LOWP		},
		{ "zero_to_minus_one",	Vec3(  0.0f,   0.0f,   0.0f), Vec3( -1.0f,  -1.0f,  -1.0f), glu::PRECISION_LOWP		},
		{ "minus_one_to_one",	Vec3( -1.0f,  -1.0f,  -1.0f), Vec3(  1.0f,   1.0f,   1.0f), glu::PRECISION_LOWP		},
		{ "minus_ten_to_ten",	Vec3(-10.0f, -10.0f, -10.0f), Vec3( 10.0f,  10.0f,  10.0f), glu::PRECISION_MEDIUMP	},
		{ "thousands",			Vec3( -5e3f,   1e3f,   1e3f), Vec3(  3e3f,  -1e3f,   7e3f), glu::PRECISION_MEDIUMP	},
		{ "full_mediump",		Vec3(minF16, minF16, minF16), Vec3(maxF16, maxF16, maxF16), glu::PRECISION_MEDIUMP	},
		{ "full_highp",			Vec3(minF32, minF32, minF32), Vec3(maxF32, maxF32, maxF32), glu::PRECISION_HIGHP	},
	};

	for (int precision = glu::PRECISION_LOWP; precision <= glu::PRECISION_HIGHP; precision++)
	{
		for (int coordNdx = 0; coordNdx < DE_LENGTH_OF_ARRAY(coordRanges); coordNdx++)
		{
			if (precision < (int)coordRanges[coordNdx].minPrecision)
				continue;

			string baseName = string(glu::getPrecisionName((glu::Precision)precision)) + "_" + coordRanges[coordNdx].name;

			addChild(new InterpolationCase(m_context, baseName.c_str(),				"",	(glu::Precision)precision, coordRanges[coordNdx].minVal, coordRanges[coordNdx].maxVal, false));
			addChild(new InterpolationCase(m_context, (baseName + "_proj").c_str(),	"",	(glu::Precision)precision, coordRanges[coordNdx].minVal, coordRanges[coordNdx].maxVal, true));
		}
	}
}